

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O3

void S2RegionCoverer::FloodFill
               (S2Region *region,S2CellId start,vector<S2CellId,_std::allocator<S2CellId>_> *output)

{
  pointer pSVar1;
  iterator __position;
  int iVar2;
  int edge;
  long lVar3;
  pair<std::__detail::_Node_iterator<S2CellId,_true,_true>,_bool> pVar4;
  vector<S2CellId,_std::allocator<S2CellId>_> frontier;
  S2CellId nbr;
  S2CellId id;
  __node_gen_type __node_gen;
  unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_> all;
  S2CellId *local_f8;
  iterator iStack_f0;
  S2CellId *local_e8;
  S2CellId local_d8;
  S2CellId local_d0;
  S2CellId local_c8;
  S2Region *local_c0;
  vector<S2CellId,std::allocator<S2CellId>> *local_b8;
  _Hashtable<S2CellId,_S2CellId,_std::allocator<S2CellId>,_std::__detail::_Identity,_std::equal_to<S2CellId>,_S2CellIdHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_b0;
  S2Cell local_a8;
  _Hashtable<S2CellId,_S2CellId,_std::allocator<S2CellId>,_std::__detail::_Identity,_std::equal_to<S2CellId>,_S2CellIdHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_f8 = (S2CellId *)0x0;
  iStack_f0._M_current = (S2CellId *)0x0;
  local_e8 = (S2CellId *)0x0;
  pSVar1 = (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
      super__Vector_impl_data._M_finish != pSVar1) {
    (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  local_d8.id_ = start.id_;
  local_b8 = (vector<S2CellId,std::allocator<S2CellId>> *)output;
  local_a8.super_S2Region._vptr_S2Region = (_func_int **)&local_68;
  std::
  _Hashtable<S2CellId,S2CellId,std::allocator<S2CellId>,std::__detail::_Identity,std::equal_to<S2CellId>,S2CellIdHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<S2CellId_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<S2CellId,true>>>>
            ((_Hashtable<S2CellId,S2CellId,std::allocator<S2CellId>,std::__detail::_Identity,std::equal_to<S2CellId>,S2CellIdHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_68,&local_d8);
  if (iStack_f0._M_current == local_e8) {
    std::vector<S2CellId,std::allocator<S2CellId>>::_M_realloc_insert<S2CellId_const&>
              ((vector<S2CellId,std::allocator<S2CellId>> *)&local_f8,iStack_f0,&local_d8);
  }
  else {
    (iStack_f0._M_current)->id_ = local_d8.id_;
    iStack_f0._M_current = iStack_f0._M_current + 1;
  }
  if (local_f8 != iStack_f0._M_current) {
    local_c0 = region;
    do {
      local_c8.id_ = iStack_f0._M_current[-1].id_;
      iStack_f0._M_current = iStack_f0._M_current + -1;
      S2Cell::S2Cell(&local_a8,local_c8);
      iVar2 = (*region->_vptr_S2Region[7])(region,&local_a8);
      if ((char)iVar2 != '\0') {
        __position._M_current = *(S2CellId **)(local_b8 + 8);
        if (__position._M_current == *(S2CellId **)(local_b8 + 0x10)) {
          std::vector<S2CellId,std::allocator<S2CellId>>::_M_realloc_insert<S2CellId_const&>
                    (local_b8,__position,&local_c8);
        }
        else {
          (__position._M_current)->id_ = local_c8.id_;
          *(S2CellId **)(local_b8 + 8) = __position._M_current + 1;
        }
        local_a8._16_8_ = 0;
        local_a8.uv_.bounds_[0].bounds_.c_[0] = 0.0;
        local_a8.super_S2Region._vptr_S2Region = (_func_int **)0x0;
        local_a8._8_8_ = 0;
        S2CellId::GetEdgeNeighbors(&local_c8,(S2CellId *)&local_a8);
        lVar3 = 0;
        do {
          local_d0.id_ = (uint64)local_a8.uv_.bounds_[0].bounds_.c_[lVar3 + -3];
          local_b0 = &local_68;
          pVar4 = std::
                  _Hashtable<S2CellId,S2CellId,std::allocator<S2CellId>,std::__detail::_Identity,std::equal_to<S2CellId>,S2CellIdHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::
                  _M_insert<S2CellId_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<S2CellId,true>>>>
                            ((_Hashtable<S2CellId,S2CellId,std::allocator<S2CellId>,std::__detail::_Identity,std::equal_to<S2CellId>,S2CellIdHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)&local_68,&local_d0,&local_b0);
          if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (iStack_f0._M_current == local_e8) {
              std::vector<S2CellId,std::allocator<S2CellId>>::_M_realloc_insert<S2CellId_const&>
                        ((vector<S2CellId,std::allocator<S2CellId>> *)&local_f8,iStack_f0,&local_d0)
              ;
            }
            else {
              (iStack_f0._M_current)->id_ = local_d0.id_;
              iStack_f0._M_current = iStack_f0._M_current + 1;
            }
          }
          lVar3 = lVar3 + 1;
          region = local_c0;
        } while (lVar3 != 4);
      }
    } while (local_f8 != iStack_f0._M_current);
  }
  if (local_f8 != (S2CellId *)0x0) {
    operator_delete(local_f8);
  }
  std::
  _Hashtable<S2CellId,_S2CellId,_std::allocator<S2CellId>,_std::__detail::_Identity,_std::equal_to<S2CellId>,_S2CellIdHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void S2RegionCoverer::FloodFill(const S2Region& region, S2CellId start,
                                vector<S2CellId>* output) {
  unordered_set<S2CellId, S2CellIdHash> all;
  vector<S2CellId> frontier;
  output->clear();
  all.insert(start);
  frontier.push_back(start);
  while (!frontier.empty()) {
    S2CellId id = frontier.back();
    frontier.pop_back();
    if (!region.MayIntersect(S2Cell(id))) continue;
    output->push_back(id);

    S2CellId neighbors[4];
    id.GetEdgeNeighbors(neighbors);
    for (int edge = 0; edge < 4; ++edge) {
      S2CellId nbr = neighbors[edge];
      if (all.insert(nbr).second) {
        frontier.push_back(nbr);
      }
    }
  }
}